

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_reserve_failure_biggerThanMaxCapacity_fn(int _i)

{
  bool bVar1;
  size_t sVar2;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_7;
  void *_ck_x_6;
  intmax_t _ck_y_4;
  intmax_t _ck_x_5;
  intmax_t _ck_y_3;
  intmax_t _ck_x_4;
  void *_ck_x_3;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  private_ACUtilsTest_ADynArray_CharArray array;
  size_t i;
  int _i_local;
  
  memcpy(&_ck_x,&PTR_private_ACUtilsTest_ADynArray_realloc_001a6bc0,0x30);
  array.growStrategy = (ACUtilsGrowStrategy)0x8;
  array.deallocator = private_ACUtilsTest_ADynArray_growStrategy;
  array.size = 8;
  private_ACUtilsTest_ADynArray_reallocFail = false;
  array.capacity = (*(code *)_ck_x)(0,8);
  for (array.buffer = (char *)0x0; array.buffer < array.growStrategy + -1;
      array.buffer = array.buffer + 1) {
    array.buffer[array.capacity] = '5';
  }
  array.growStrategy[array.capacity - 1] = (_func_size_t_size_t_size_t)0x30;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_reserve(&_ck_x,0x21,false,1);
  if ((ulong)bVar1 != 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x10c,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 1, false, sizeof(*(&array)->buffer)) == false"
                      ,
                      "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 1, false, sizeof(*(&array)->buffer))"
                      ,(ulong)bVar1,"false",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x10c);
  if (array.growStrategy != (ACUtilsGrowStrategy)0x8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x10d,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "array.size == private_ACUtilsTest_ADynArray_capacityMin","array.size",
                      array.growStrategy,"private_ACUtilsTest_ADynArray_capacityMin",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x10d);
  if (array.size == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x10e);
    if (array.capacity == 0) {
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x10f,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x","(void*) array.buffer != NULL",
                        "(void*) array.buffer",0,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x10f);
    for (array.buffer = (char *)0x0; array.buffer < (char *)0x7; array.buffer = array.buffer + 1) {
      if ((long)array.buffer[array.capacity] != 0x35) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x111,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %jd, %s == %jd","array.buffer[i] == \'5\'"
                          ,"array.buffer[i]",(long)array.buffer[array.capacity],"\'5\'",0x35,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x111);
    }
    if ((long)*(char *)(array.capacity + 7) != 0x30) {
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x112,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                        "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'",
                        "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]",
                        (long)*(char *)(array.capacity + 7),"\'0\'",0x30,0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x112);
    if (array.deallocator != (ACUtilsDeallocator)0x0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x113);
      if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
        sVar2 = 0x114;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x114);
        (*array.reallocator)((void *)array.capacity,sVar2);
        return;
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x114,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                        "private_ACUtilsTest_ADynArray_reallocCount == 0",
                        "private_ACUtilsTest_ADynArray_reallocCount",
                        private_ACUtilsTest_ADynArray_reallocCount,"0",0,0);
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x113,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) array.growStrategy != NULL",
                      "(void*) array.growStrategy",0,0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x10e,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                    "array.capacity == private_ACUtilsTest_ADynArray_capacityMin","array.capacity",
                    array.size,"private_ACUtilsTest_ADynArray_capacityMin",8,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_failure_biggerThanMaxCapacity)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax + 1), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}